

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.hpp
# Opt level: O2

Option<Kernel::TermList> __thiscall
MemoNonVars<Kernel::PolyNf,_Kernel::TermList>::get
          (MemoNonVars<Kernel::PolyNf,_Kernel::TermList> *this,PolyNf *orig)

{
  undefined1 uVar1;
  undefined8 *in_RAX;
  Value in_RDX;
  Value extraout_RDX;
  Option<Kernel::TermList> OVar2;
  undefined8 *local_18;
  
  if ((*(byte *)in_RDX & 3) != 1) {
    local_18 = in_RAX;
    Lib::Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash>::tryGet
              ((Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash> *)&local_18,orig);
    in_RDX = extraout_RDX;
    if (local_18 != (undefined8 *)0x0) {
      (this->_memo)._entries = (Entry *)*local_18;
      uVar1 = 1;
      goto LAB_00473c3d;
    }
  }
  (this->_memo)._capacity = 0;
  (this->_memo)._noOfEntries = 0;
  (this->_memo)._entries = (Entry *)0x0;
  uVar1 = 0;
LAB_00473c3d:
  *(undefined1 *)&(this->_memo)._capacity = uVar1;
  OVar2.super_OptionBase<Kernel::TermList>._elem._elem = in_RDX;
  OVar2.super_OptionBase<Kernel::TermList>._0_8_ = this;
  return (Option<Kernel::TermList>)OVar2.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<Result> get(const Arg& orig)
  { return isVar(orig) ? Option<Result>() : _memo.tryGet(orig).toOwned(); }